

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::detail::convertFlaggedUnits<units::unit,units::precise_unit>
                 (double val,unit *start,precise_unit *result,double basis)

{
  precise_unit *this;
  unit *puVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  unit_data local_34;
  double local_30;
  double basis_local;
  precise_unit *result_local;
  unit *start_local;
  double val_local;
  
  local_30 = basis;
  basis_local = (double)result;
  result_local = (precise_unit *)start;
  start_local = (unit *)val;
  bVar2 = is_temperature(start);
  if ((bVar2) || (bVar2 = is_temperature((precise_unit *)basis_local), this = result_local, bVar2))
  {
    dVar5 = convertTemperature<units::unit,units::precise_unit>
                      ((double)start_local,(unit *)result_local,(precise_unit *)basis_local);
    return dVar5;
  }
  local_34 = precise_unit::base_units((precise_unit *)precise::pressure::psi);
  bVar2 = unit::has_same_base((unit *)this,&local_34);
  if (!bVar2) {
    return NAN;
  }
  bVar2 = unit::has_e_flag((unit *)result_local);
  bVar3 = precise_unit::has_e_flag((precise_unit *)basis_local);
  puVar1 = start_local;
  if (bVar2 == bVar3) {
    dVar5 = unit::multiplier((unit *)result_local);
    dVar6 = precise_unit::multiplier((precise_unit *)basis_local);
    return ((double)puVar1 * dVar5) / dVar6;
  }
  bVar2 = unit::has_e_flag((unit *)result_local);
  if (bVar2) {
    uVar4 = std::isnan(local_30);
    puVar1 = start_local;
    if ((uVar4 & 1) == 0) {
      dVar5 = (double)start_local + local_30;
      dVar6 = unit::multiplier((unit *)result_local);
      dVar7 = precise_unit::multiplier((precise_unit *)basis_local);
      return (dVar5 * dVar6) / dVar7;
    }
    dVar5 = unit::multiplier((unit *)result_local);
    dVar6 = precise_unit::multiplier((precise_unit *)precise::pressure::atm);
    dVar7 = precise_unit::multiplier((precise_unit *)basis_local);
    return ((double)puVar1 * dVar5 + dVar6) / dVar7;
  }
  uVar4 = std::isnan(local_30);
  puVar1 = start_local;
  if ((uVar4 & 1) == 0) {
    dVar5 = unit::multiplier((unit *)result_local);
    dVar6 = precise_unit::multiplier((precise_unit *)basis_local);
    return ((double)puVar1 * dVar5) / dVar6 - local_30;
  }
  dVar5 = unit::multiplier((unit *)result_local);
  dVar6 = precise_unit::multiplier((precise_unit *)precise::pressure::atm);
  dVar7 = precise_unit::multiplier((precise_unit *)basis_local);
  return ((double)puVar1 * dVar5 + -dVar6) / dVar7;
}

Assistant:

double convertFlaggedUnits(
        double val,
        const UX& start,
        const UX2& result,
        double basis = constants::invalid_conversion)
    {
        if (is_temperature(start) || is_temperature(result)) {
            return convertTemperature(val, start, result);
        }
        if (start.has_same_base(precise::pressure::psi.base_units())) {
            if (start.has_e_flag() == result.has_e_flag()) {
                return val * start.multiplier() / result.multiplier();
            }
            if (start.has_e_flag()) {
                if (std::isnan(basis)) {
                    return (val * start.multiplier() +
                            precise::pressure::atm.multiplier()) /
                        result.multiplier();
                }
                return (val + basis) * start.multiplier() / result.multiplier();
            }
            if (std::isnan(basis)) {
                return (val * start.multiplier() -
                        precise::pressure::atm.multiplier()) /
                    result.multiplier();
            }
            return (val * start.multiplier() / result.multiplier()) - basis;
        }
        return constants::invalid_conversion;
    }